

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<bool> *values)

{
  uint8 *puVar1;
  unsigned_long uVar2;
  byte *pbVar3;
  LogMessage *other;
  int iVar4;
  byte *pbVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  pair<unsigned_long,_bool> pVar9;
  LogFinisher local_71;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  
  puVar1 = input->buffer_;
  if ((puVar1 < input->buffer_end_) && (uVar2 = (unsigned_long)(char)*puVar1, -1 < (long)uVar2)) {
    input->buffer_ = puVar1 + 1;
  }
  else {
    pVar9 = io::CodedInputStream::ReadVarint64Fallback(input);
    uVar2 = pVar9.first;
    if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return false;
    }
  }
  iVar7 = values->current_size_;
  iVar8 = values->total_size_;
  if (iVar7 == iVar8) {
    RepeatedField<bool>::Reserve(values,iVar7 + 1);
    iVar7 = values->current_size_;
    iVar8 = values->total_size_;
  }
  iVar4 = iVar7 + 1;
  values->current_size_ = iVar4;
  values->rep_->elements[iVar7] = uVar2 != 0;
  if (iVar4 < iVar8) {
    local_6c = tag & 0xff | 0x80;
    local_70 = tag >> 7;
    iVar8 = iVar8 - iVar7;
    do {
      if (tag < 0x80) {
        pbVar5 = input->buffer_;
        pbVar3 = input->buffer_end_;
        if (pbVar3 <= pbVar5) {
          return true;
        }
        if (*pbVar5 != tag) {
          return true;
        }
        pbVar5 = pbVar5 + 1;
      }
      else {
        if (0x3fff < tag) {
          return true;
        }
        pbVar5 = input->buffer_;
        pbVar3 = input->buffer_end_;
        if ((int)pbVar3 - (int)pbVar5 < 2) {
          return true;
        }
        if (local_6c != *pbVar5) {
          return true;
        }
        if (local_70 != pbVar5[1]) {
          return true;
        }
        pbVar5 = pbVar5 + 2;
      }
      input->buffer_ = pbVar5;
      if ((pbVar5 < pbVar3) && (uVar2 = (unsigned_long)(char)*pbVar5, -1 < (long)uVar2)) {
        input->buffer_ = pbVar5 + 1;
      }
      else {
        pVar9 = io::CodedInputStream::ReadVarint64Fallback(input);
        uVar2 = pVar9.first;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        iVar4 = values->current_size_;
      }
      if (values->total_size_ <= iVar4) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x456);
        other = LogMessage::operator<<(&local_68,"CHECK failed: (current_size_) < (total_size_): ");
        LogFinisher::operator=(&local_71,other);
        LogMessage::~LogMessage(&local_68);
        iVar4 = values->current_size_;
      }
      lVar6 = (long)iVar4;
      iVar4 = iVar4 + 1;
      values->current_size_ = iVar4;
      values->rep_->elements[lVar6] = uVar2 != 0;
      iVar8 = iVar8 + -1;
    } while (1 < iVar8);
  }
  return true;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}